

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void r4k_helper_tlbp_mips64el(CPUMIPSState_conflict5 *env)

{
  uint uVar1;
  ulong uVar2;
  CPUMIPSTLBContext_conflict1 *pCVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  ushort *puVar11;
  
  uVar1 = env->CP0_Config5;
  uVar2 = env->CP0_EntryHi;
  if ((uVar1 >> 0x11 & 1) == 0) {
    uVar4 = (uint)(ushort)env->CP0_EntryHi_ASID_mask & (uint)uVar2;
  }
  else {
    uVar4 = env->CP0_MemoryMapID;
  }
  pCVar3 = env->tlb;
  uVar6 = pCVar3->nb_tlb;
  uVar7 = (ulong)uVar6;
  if (uVar7 == 0) {
    uVar10 = 0;
  }
  else {
    puVar11 = (ushort *)((long)&pCVar3->mmu + 0x14);
    uVar9 = 0;
    do {
      if ((uVar1 >> 0x11 & 1) == 0) {
        uVar5 = (uint)puVar11[-4];
      }
      else {
        uVar5 = *(uint *)(puVar11 + -2);
      }
      if (((((*puVar11 & 1) != 0) || (uVar5 == uVar4)) &&
          (((*(ulong *)(puVar11 + -10) ^ env->SEGMask & uVar2) &
           ~(ulong)*(uint *)(puVar11 + -6) & 0xffffffffffffe000) == 0)) && (-1 < (short)*puVar11)) {
        env->CP0_Index = (int32_t)uVar9;
        uVar10 = uVar9;
        break;
      }
      uVar9 = uVar9 + 1;
      puVar11 = puVar11 + 0x14;
      uVar10 = uVar7;
    } while (uVar7 != uVar9);
  }
  if ((uint)uVar10 == uVar6) {
    if (uVar6 < pCVar3->tlb_in_use) {
      pbVar8 = (byte *)((long)&pCVar3->mmu + (long)(int)uVar6 * 0x28 + 0x14);
      do {
        if ((uVar1 >> 0x11 & 1) == 0) {
          uVar6 = (uint)*(ushort *)(pbVar8 + -8);
        }
        else {
          uVar6 = *(uint *)(pbVar8 + -4);
        }
        if ((((*pbVar8 & 1) != 0) || (uVar6 == uVar4)) &&
           (((*(ulong *)(pbVar8 + -0x14) ^ uVar2 & env->SEGMask) &
            ~(ulong)*(uint *)(pbVar8 + -0xc) & 0xffffffffffffe000) == 0)) {
          r4k_mips_tlb_flush_extra(env,(int)uVar7);
          break;
        }
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
        pbVar8 = pbVar8 + 0x28;
      } while (uVar6 < pCVar3->tlb_in_use);
    }
    pbVar8 = (byte *)((long)&env->CP0_Index + 3);
    *pbVar8 = *pbVar8 | 0x80;
  }
  return;
}

Assistant:

void r4k_helper_tlbp(CPUMIPSState *env)
{
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    r4k_tlb_t *tlb;
    target_ulong mask;
    target_ulong tag;
    target_ulong VPN;
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    uint32_t tlb_mmid;
    int i;

    MMID = mi ? MMID : (uint32_t) ASID;
    for (i = 0; i < env->tlb->nb_tlb; i++) {
        tlb = &env->tlb->mmu.r4k.tlb[i];
        /* 1k pages are not supported. */
        mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
        tag = env->CP0_EntryHi & ~mask;
        VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
        tag &= env->SEGMask;
#endif
        tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
        /* Check ASID/MMID, virtual page number & size */
        if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag && !tlb->EHINV) {
            /* TLB match */
            env->CP0_Index = i;
            break;
        }
    }
    if (i == env->tlb->nb_tlb) {
        /* No match.  Discard any shadow entries, if any of them match.  */
        for (i = env->tlb->nb_tlb; i < env->tlb->tlb_in_use; i++) {
            tlb = &env->tlb->mmu.r4k.tlb[i];
            /* 1k pages are not supported. */
            mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
            tag = env->CP0_EntryHi & ~mask;
            VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
            tag &= env->SEGMask;
#endif
            tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
            /* Check ASID/MMID, virtual page number & size */
            if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag) {
                r4k_mips_tlb_flush_extra(env, i);
                break;
            }
        }

        env->CP0_Index |= 0x80000000;
    }
}